

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageChar(gdImagePtr im,gdFontPtr f,int x,int y,int c,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_38;
  int fline;
  int py;
  int px;
  int cy;
  int cx;
  int color_local;
  int c_local;
  int y_local;
  int x_local;
  gdFontPtr f_local;
  gdImagePtr im_local;
  
  py = 0;
  if ((f->offset <= c) && (c < f->offset + f->nchars)) {
    iVar1 = f->offset;
    iVar2 = f->h;
    iVar3 = f->w;
    for (local_38 = y; px = 0, fline = x, local_38 < y + f->h; local_38 = local_38 + 1) {
      for (; fline < x + f->w; fline = fline + 1) {
        if (f->data[(c - iVar1) * iVar2 * iVar3 + py * f->w + px] != '\0') {
          gdImageSetPixel(im,fline,local_38,color);
        }
        px = px + 1;
      }
      py = py + 1;
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageChar (gdImagePtr im, gdFontPtr f, int x, int y, int c, int color)
{
	int cx, cy;
	int px, py;
	int fline;
	cx = 0;
	cy = 0;
#ifdef CHARSET_EBCDIC
	c = ASC (c);
#endif /*CHARSET_EBCDIC */
	if ((c < f->offset) || (c >= (f->offset + f->nchars))) {
		return;
	}
	fline = (c - f->offset) * f->h * f->w;
	for (py = y; (py < (y + f->h)); py++) {
		for (px = x; (px < (x + f->w)); px++) {
			if (f->data[fline + cy * f->w + cx]) {
				gdImageSetPixel (im, px, py, color);
			}
			cx++;
		}
		cx = 0;
		cy++;
	}
}